

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_iterator.hpp
# Opt level: O2

void __thiscall
asio::ip::basic_resolver_iterator<asio::ip::tcp>::increment
          (basic_resolver_iterator<asio::ip::tcp> *this)

{
  element_type *peVar1;
  size_t sVar2;
  
  peVar1 = (this->values_).
           super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar2 = this->index_ + 1;
  this->index_ = sVar2;
  if (sVar2 == ((long)(peVar1->
                      super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->
                     super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x60) {
    std::
    __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::reset((__shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
             *)this);
    this->index_ = 0;
  }
  return;
}

Assistant:

void increment()
  {
    if (++index_ == values_->size())
    {
      // Reset state to match a default constructed end iterator.
      values_.reset();
      index_ = 0;
    }
  }